

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O2

void __thiscall HostUI::render_draw_lists(HostUI *this,ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  ImDrawList *this_00;
  undefined1 auVar3 [16];
  ImGuiIO *pIVar4;
  ImDrawCmd *pIVar5;
  undefined4 in_ECX;
  long lVar6;
  int i;
  int n;
  long lVar7;
  int iVar8;
  int iVar9;
  
  pIVar4 = ImGui::GetIO();
  iVar8 = (int)((pIVar4->DisplayFramebufferScale).x * (pIVar4->DisplaySize).x);
  iVar9 = (int)((pIVar4->DisplayFramebufferScale).y * (pIVar4->DisplaySize).y);
  auVar3._4_4_ = -(uint)(iVar8 == 0);
  auVar3._0_4_ = -(uint)(iVar8 == 0);
  auVar3._8_4_ = -(uint)(iVar9 == 0);
  auVar3._12_4_ = -(uint)(iVar9 == 0);
  iVar8 = movmskpd(in_ECX,auVar3);
  if (iVar8 != 0) {
    return;
  }
  ImDrawData::ScaleClipRects(draw_data,&pIVar4->DisplayFramebufferScale);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glDisable(0xb44);
  glDisable(0xb71);
  glEnable(0xc11);
  (*glUseProgram)(this->program);
  (*glUniform1i)(this->uSampler,0);
  (*glUniformMatrix3fv)(this->uProjMatrix,1,'\0',(GLfloat *)this->proj_matrix);
  (*glBindVertexArray)(this->vao);
  for (lVar7 = 0; lVar7 < draw_data->CmdListsCount; lVar7 = lVar7 + 1) {
    this_00 = draw_data->CmdLists[lVar7];
    (*glBindBuffer)(0x8892,this->vbo);
    (*glBufferData)(0x8892,(long)(this_00->VtxBuffer).Size * 0x14,(this_00->VtxBuffer).Data,0x88e0);
    (*glBindBuffer)(0x8893,this->ebo);
    (*glBufferData)(0x8893,(long)(this_00->IdxBuffer).Size * 2,(this_00->IdxBuffer).Data,0x88e0);
    lVar6 = 0;
    for (iVar8 = 0; iVar8 < (this_00->CmdBuffer).Size; iVar8 = iVar8 + 1) {
      pIVar5 = ImVector<ImDrawCmd>::operator[](&this_00->CmdBuffer,iVar8);
      if (pIVar5->UserCallback == (ImDrawCallback)0x0) {
        glBindTexture(0xde1,*(undefined4 *)&pIVar5->TextureId);
        fVar1 = (pIVar5->ClipRect).x;
        fVar2 = (pIVar5->ClipRect).w;
        glScissor((int)fVar1,(int)((float)iVar9 - fVar2),(int)((pIVar5->ClipRect).z - fVar1),
                  (int)(fVar2 - (pIVar5->ClipRect).y));
        glDrawElements(4,pIVar5->ElemCount,0x1403,lVar6);
      }
      else {
        (*pIVar5->UserCallback)(this_00,pIVar5);
      }
      lVar6 = lVar6 + (ulong)pIVar5->ElemCount * 2;
    }
  }
  glDisable(0xc11);
  glDisable(0xbe2);
  return;
}

Assistant:

void HostUI::render_draw_lists(ImDrawData* draw_data) {
  ImGuiIO& io = ImGui::GetIO();
  int fb_width = (int)(io.DisplaySize.x * io.DisplayFramebufferScale.x);
  int fb_height = (int)(io.DisplaySize.y * io.DisplayFramebufferScale.y);
  if (fb_width == 0 || fb_height == 0) {
    return;
  }

  draw_data->ScaleClipRects(io.DisplayFramebufferScale);

  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
  glDisable(GL_CULL_FACE);
  glDisable(GL_DEPTH_TEST);
  glEnable(GL_SCISSOR_TEST);

  glUseProgram(program);
  glUniform1i(uSampler, 0);
  glUniformMatrix3fv(uProjMatrix, 1, GL_FALSE, proj_matrix);
  glBindVertexArray(vao);

  for (int n = 0; n < draw_data->CmdListsCount; n++) {
    const ImDrawList* cmd_list = draw_data->CmdLists[n];
    const ImDrawIdx* idx_buffer_offset = 0;

    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    glBufferData(GL_ARRAY_BUFFER,
                 (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert),
                 (GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, ebo);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER,
                 (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx),
                 (GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

    for (int i = 0; i < cmd_list->CmdBuffer.Size; i++) {
      const ImDrawCmd* cmd = &cmd_list->CmdBuffer[i];
      if (cmd->UserCallback) {
        cmd->UserCallback(cmd_list, cmd);
      } else {
        glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)cmd->TextureId);
        glScissor((int)cmd->ClipRect.x, (int)(fb_height - cmd->ClipRect.w),
                  (int)(cmd->ClipRect.z - cmd->ClipRect.x),
                  (int)(cmd->ClipRect.w - cmd->ClipRect.y));
        glDrawElements(
            GL_TRIANGLES, (GLsizei)cmd->ElemCount,
            sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT,
            idx_buffer_offset);
      }
      idx_buffer_offset += cmd->ElemCount;
    }
  }

  glDisable(GL_SCISSOR_TEST);
  glDisable(GL_BLEND);
}